

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinLoader.cpp
# Opt level: O1

void ReadArray<aiQuatKey>(IOStream *stream,aiQuatKey *out,uint size)

{
  long lVar1;
  double dVar2;
  aiQuaternion aVar3;
  
  if (stream == (IOStream *)0x0) {
    __assert_fail("nullptr != stream",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Assbin/AssbinLoader.cpp"
                  ,0xc6,"void ReadArray(IOStream *, T *, unsigned int) [T = aiQuatKey]");
  }
  if (out != (aiQuatKey *)0x0) {
    if (size != 0) {
      lVar1 = 0;
      do {
        dVar2 = Read<double>(stream);
        aVar3 = Read<aiQuaterniont<float>>(stream);
        *(double *)((long)&out->mTime + lVar1) = dVar2;
        *(aiQuaternion *)((long)&(out->mValue).w + lVar1) = aVar3;
        lVar1 = lVar1 + 0x18;
      } while ((ulong)size * 0x18 != lVar1);
    }
    return;
  }
  __assert_fail("nullptr != out",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/code/Assbin/AssbinLoader.cpp"
                ,199,"void ReadArray(IOStream *, T *, unsigned int) [T = aiQuatKey]");
}

Assistant:

void ReadArray( IOStream *stream, T * out, unsigned int size) {
    ai_assert( nullptr != stream );
    ai_assert( nullptr != out );

    for (unsigned int i=0; i<size; i++) {
        out[i] = Read<T>(stream);
    }
}